

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidLayerNormalizationNoNormalizedShape(void)

{
  bool bVar1;
  ModelDescription *pMVar2;
  FeatureType *pFVar3;
  WeightParams *pWVar4;
  string *psVar5;
  long lVar6;
  ostream *poVar7;
  Result local_b0;
  LayerNormalizationLayerParams *params;
  NeuralNetworkLayer *layers;
  NeuralNetwork *nn;
  ArrayFeatureType *outShape;
  FeatureDescription *out;
  ArrayFeatureType *inShape;
  FeatureDescription *local_48;
  FeatureDescription *in;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&in);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  local_48 = CoreML::Specification::ModelDescription::add_input(pMVar2);
  CoreML::Specification::FeatureDescription::set_name(local_48,"input");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  out = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,5);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,2);
  pMVar2 = CoreML::Specification::Model::mutable_description((Model *)&in);
  outShape = (ArrayFeatureType *)CoreML::Specification::ModelDescription::add_output(pMVar2);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)outShape,"output");
  pFVar3 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)outShape);
  nn = (NeuralNetwork *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)nn,3);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)nn,5);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)nn,2);
  layers = (NeuralNetworkLayer *)CoreML::Specification::Model::mutable_neuralnetwork((Model *)&in);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping
            ((NeuralNetwork *)layers,EXACT_ARRAY_MAPPING);
  params = (LayerNormalizationLayerParams *)
           CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)layers);
  CoreML::Specification::NeuralNetworkLayer::add_input((NeuralNetworkLayer *)params,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output((NeuralNetworkLayer *)params,"output");
  local_b0.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NeuralNetworkLayer::mutable_layernormalization
                 ((NeuralNetworkLayer *)params);
  pWVar4 = CoreML::Specification::LayerNormalizationLayerParams::mutable_gamma
                     ((LayerNormalizationLayerParams *)local_b0.m_message._M_storage._M_storage);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar4,1.0);
  pWVar4 = CoreML::Specification::LayerNormalizationLayerParams::mutable_beta
                     ((LayerNormalizationLayerParams *)local_b0.m_message._M_storage._M_storage);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar4,0.0);
  CoreML::validate<(MLModelType)500>(&local_b0,(Model *)&in);
  bVar1 = CoreML::Result::good(&local_b0);
  if (bVar1) {
    poVar7 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar7 = std::operator<<(poVar7,":");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x16b7);
    poVar7 = std::operator<<(poVar7,": error: ");
    poVar7 = std::operator<<(poVar7,"!((res).good())");
    poVar7 = std::operator<<(poVar7," was false, expected true.");
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    m._oneof_case_[0] = 1;
  }
  else {
    psVar5 = CoreML::Result::message_abi_cxx11_(&local_b0);
    lVar6 = std::__cxx11::string::find((char *)psVar5,0x43cd4c);
    if (lVar6 == -1) {
      poVar7 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                              );
      poVar7 = std::operator<<(poVar7,":");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,0x16b8);
      poVar7 = std::operator<<(poVar7,": error: ");
      poVar7 = std::operator<<(poVar7,
                               "res.message().find(\"Normalized shape\") != std::string::npos");
      poVar7 = std::operator<<(poVar7," was false, expected true.");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      m._oneof_case_[0] = 1;
    }
    else {
      m._oneof_case_[0] = 0;
    }
  }
  CoreML::Result::~Result(&local_b0);
  CoreML::Specification::Model::~Model((Model *)&in);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidLayerNormalizationNoNormalizedShape() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    auto* params = layers->mutable_layernormalization();
    params->mutable_gamma()->add_floatvalue(1.0);
    params->mutable_beta()->add_floatvalue(0.0);

    // not specifying the value for normalized shape
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    ML_ASSERT(res.message().find("Normalized shape") != std::string::npos);

    return 0;

}